

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

bool_t NodeHibernate(anynode *AnyNode)

{
  nodecontext *p;
  int iVar1;
  char *pcVar2;
  bool_t bVar3;
  int iVar4;
  int iVar5;
  bool_t bVar6;
  char *pcVar7;
  int iVar8;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0xb2b,"bool_t NodeHibernate(anynode *)");
  }
  p = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  if (p->InCollect == 0) {
    p->InCollect = 1;
    bVar3 = 1;
    bVar6 = 0;
    iVar8 = 0;
    do {
      if (bVar6 != 0) goto LAB_0011eb41;
      iVar5 = 0x7fffffff;
      bVar6 = 0;
      pcVar2 = (p->Collect)._Begin;
      for (pcVar7 = pcVar2; pcVar7 != pcVar2 + ((p->Collect)._Used & 0xfffffffffffffff0);
          pcVar7 = pcVar7 + 0x10) {
        iVar1 = (**(code **)pcVar7)(*(undefined8 *)(pcVar7 + 8));
        iVar4 = iVar1;
        if (iVar5 < iVar1) {
          iVar4 = iVar5;
        }
        if (iVar1 <= iVar8) {
          iVar4 = iVar5;
        }
        if (iVar1 == -1) {
          bVar6 = bVar3;
          iVar4 = iVar5;
        }
        iVar5 = iVar4;
        pcVar2 = (p->Collect)._Begin;
      }
      iVar8 = iVar5;
    } while (iVar5 != 0x7fffffff);
    if (bVar6 == 0) {
      bVar3 = NodeContext_Cleanup(p,0);
    }
LAB_0011eb41:
    p->InCollect = 0;
  }
  else {
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

bool_t NodeHibernate(anynode* AnyNode)
{
    nodecontext* p = Node_Context(AnyNode);
    bool_t Changed = 0;

    if (!p->InCollect)
    {
        int Level;
        int NextLevel;
        memcollectitem* i;
        p->InCollect = 1;

        for (Level=COLLECT_UNUSED;!Changed;Level=NextLevel)
        {
            NextLevel = INT_MAX;
            for (i=ARRAYBEGIN(p->Collect,memcollectitem);i!=ARRAYEND(p->Collect,memcollectitem);++i)
            {
                int v=i->Func(i->Cookie,Level);
                if (v==COLLECT_FOUND)
                    Changed=1;
                else
                if (NextLevel>v && v>Level)
                    NextLevel=v;
            }
            if (NextLevel==INT_MAX)
                break;
        }

        if (!Changed && NodeContext_Cleanup(p,0))
            Changed = 1;

        p->InCollect = 0;
    }

    return Changed;
}